

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<QtGraphicsAnchorLayout::AnchorVertex_*> * __thiscall
QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>::keys
          (QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*> *this
          )

{
  key_iterator i1;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *in_RDI;
  undefined1 in_stack_00000020 [16];
  Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
  *in_stack_00000030;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *this_00;
  undefined8 local_30;
  
  this_00 = in_RDI;
  keyBegin(local_30);
  keyEnd(local_30);
  i1.i.i.bucket = (size_t)this;
  i1.i.i.d = in_stack_00000030;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*>::
  QList<QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>::key_iterator,_true>
            (this_00,i1,(key_iterator)in_stack_00000020);
  return in_RDI;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }